

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_base.cpp
# Opt level: O2

int __thiscall zmq::hello_msg_session_t::pull_msg(hello_msg_session_t *this,msg_t *msg_)

{
  pipe_t *this_00;
  pointer buf_;
  byte bVar1;
  int iVar2;
  ssize_t sVar3;
  int *piVar4;
  char *errmsg_;
  size_t in_RCX;
  void *in_RDX;
  
  if (this->_new_pipe == true) {
    this->_new_pipe = false;
    buf_ = (this->super_session_base_t).super_own_t.options.hello_msg.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
    iVar2 = msg_t::init_buffer(msg_,buf_,
                               (long)*(pointer *)
                                      ((long)&(this->super_session_base_t).super_own_t.options.
                                              hello_msg.
                                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                              ._M_impl.super__Vector_impl_data + 8) - (long)buf_);
    if (iVar2 != 0) {
      piVar4 = __errno_location();
      errmsg_ = strerror(*piVar4);
      fprintf(_stderr,"%s (%s:%d)\n",errmsg_,
              "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/session_base.cpp"
              ,799);
      fflush(_stderr);
      zmq_abort(errmsg_);
    }
    return 0;
  }
  this_00 = (this->super_session_base_t)._pipe;
  if ((this_00 != (pipe_t *)0x0) &&
     (sVar3 = pipe_t::read(this_00,(int)msg_,in_RDX,in_RCX), (char)sVar3 != '\0')) {
    bVar1 = msg_t::flags(msg_);
    (this->super_session_base_t)._incomplete_in = (bool)(bVar1 & 1);
    return 0;
  }
  piVar4 = __errno_location();
  *piVar4 = 0xb;
  return -1;
}

Assistant:

int zmq::hello_msg_session_t::pull_msg (msg_t *msg_)
{
    if (_new_pipe) {
        _new_pipe = false;

        const int rc =
          msg_->init_buffer (&options.hello_msg[0], options.hello_msg.size ());
        errno_assert (rc == 0);

        return 0;
    }

    return session_base_t::pull_msg (msg_);
}